

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

void __thiscall FTOutline::grow(FTOutline *this,size_t points,size_t segments)

{
  char *pcVar1;
  
  (this->ft).n_contours = 0;
  (this->ft).n_points = 0;
  (this->ft).flags = 0;
  dyn_array<SW_FT_Vector_>::reserve(&this->mPointMemory,points + segments);
  dyn_array<char>::reserve(&this->mTagMemory,points + segments);
  dyn_array<short>::reserve(&this->mContourMemory,segments);
  dyn_array<char>::reserve(&this->mContourFlagMemory,segments);
  pcVar1 = (this->mTagMemory).mData._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
           _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (this->ft).points =
       (this->mPointMemory).mData._M_t.
       super___uniq_ptr_impl<SW_FT_Vector_,_std::default_delete<SW_FT_Vector_[]>_>._M_t.
       super__Tuple_impl<0UL,_SW_FT_Vector__*,_std::default_delete<SW_FT_Vector_[]>_>.
       super__Head_base<0UL,_SW_FT_Vector__*,_false>._M_head_impl;
  (this->ft).tags = pcVar1;
  (this->ft).contours =
       (this->mContourMemory).mData._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>
       ._M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
       super__Head_base<0UL,_short_*,_false>._M_head_impl;
  (this->ft).contours_flag =
       (this->mContourFlagMemory).mData._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  return;
}

Assistant:

void FTOutline::grow(size_t points, size_t segments)
{
    reset();
    mPointMemory.reserve(points + segments);
    mTagMemory.reserve(points + segments);
    mContourMemory.reserve(segments);
    mContourFlagMemory.reserve(segments);

    ft.points = mPointMemory.data();
    ft.tags = mTagMemory.data();
    ft.contours = mContourMemory.data();
    ft.contours_flag = mContourFlagMemory.data();
}